

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cx_string.hpp
# Opt level: O0

cx_string<123UL> *
mserialize::cx_strcat<41ul,41ul,41ul>
          (cx_string<41UL> *strings,cx_string<41UL> *strings_1,cx_string<41UL> *strings_2)

{
  cx_string<41UL> *in_RCX;
  cx_string<41UL> *in_RDX;
  cx_string<41UL> *in_RSI;
  cx_string<123UL> *in_RDI;
  size_t s;
  size_t i;
  char *out;
  size_t size [4];
  char *data [4];
  char buffer [124];
  char *in_stack_ffffffffffffff10;
  ulong local_e8;
  char *local_e0;
  ulong local_d8;
  size_t local_d0;
  size_t local_c8;
  size_t local_c0;
  char *local_b8;
  data_ref local_b0;
  data_ref local_a8;
  data_ref local_a0;
  char local_98 [128];
  cx_string<41UL> *local_18;
  cx_string<41UL> *local_10;
  cx_string<41UL> *local_8;
  
  local_18 = in_RCX;
  local_10 = in_RDX;
  local_8 = in_RSI;
  memset(local_98,0,0x7c);
  local_b8 = "";
  local_b0 = cx_string<41UL>::data(local_8);
  local_a8 = cx_string<41UL>::data(local_10);
  local_a0 = cx_string<41UL>::data(local_18);
  local_d8 = 0;
  local_d0 = cx_string<41UL>::size(local_8);
  local_c8 = cx_string<41UL>::size(local_10);
  local_c0 = cx_string<41UL>::size(local_18);
  local_e0 = local_98;
  for (local_e8 = 1; local_e8 < 4; local_e8 = local_e8 + 1) {
    for (in_stack_ffffffffffffff10 = (char *)0x0;
        in_stack_ffffffffffffff10 < (cx_string<123UL> *)(&local_d8)[local_e8];
        in_stack_ffffffffffffff10 = in_stack_ffffffffffffff10 + 1) {
      *local_e0 = in_stack_ffffffffffffff10[(long)(&local_b8)[local_e8]];
      local_e0 = local_e0 + 1;
    }
  }
  cx_string<123UL>::cx_string((cx_string<123UL> *)in_stack_ffffffffffffff10,in_RDI->_data);
  return in_RDI;
}

Assistant:

constexpr auto cx_strcat(const cx_string<N>&&... strings)
{
  char buffer[detail::sum<N...>()+1] = {0};
  const char* data[] = {"", strings.data()...};
  const std::size_t size[] = {0, strings.size()...};

  char* out = buffer;
  for (std::size_t i = 1; i <= sizeof...(N); ++i)
  {
    for (std::size_t s = 0; s < size[i]; ++s) { *out++ = data[i][s]; } // NOLINT
  }

  return cx_string<sizeof(buffer)-1>(buffer);
}